

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListAppendFromTerm
                    (Parse *pParse,SrcList *p,Token *pTable,Token *pDatabase,Token *pAlias,
                    Select *pSubquery,Expr *pOn,IdList *pUsing)

{
  sqlite3 *db_00;
  SrcList *pSVar1;
  int iVar2;
  char *pcVar3;
  Token *local_60;
  Token *pToken;
  sqlite3 *db;
  SrcList_item *pItem;
  Select *pSubquery_local;
  Token *pAlias_local;
  Token *pDatabase_local;
  Token *pTable_local;
  SrcList *p_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if ((p == (SrcList *)0x0) && ((pOn != (Expr *)0x0 || (pUsing != (IdList *)0x0)))) {
    pcVar3 = "USING";
    if (pOn != (Expr *)0x0) {
      pcVar3 = "ON";
    }
    sqlite3ErrorMsg(pParse,"a JOIN clause is required before %s",pcVar3);
  }
  else {
    pSVar1 = sqlite3SrcListAppend(pParse,p,pTable,pDatabase);
    if (pSVar1 != (SrcList *)0x0) {
      iVar2 = pSVar1->nSrc + -1;
      if ((1 < pParse->eParseMode) && (pSVar1->a[iVar2].zName != (char *)0x0)) {
        local_60 = pTable;
        if ((pDatabase != (Token *)0x0) && (pDatabase->z != (char *)0x0)) {
          local_60 = pDatabase;
        }
        sqlite3RenameTokenMap(pParse,pSVar1->a[iVar2].zName,local_60);
      }
      if (pAlias->n != 0) {
        pcVar3 = sqlite3NameFromToken(db_00,pAlias);
        pSVar1->a[iVar2].zAlias = pcVar3;
      }
      pSVar1->a[iVar2].pSelect = pSubquery;
      pSVar1->a[iVar2].pOn = pOn;
      pSVar1->a[iVar2].pUsing = pUsing;
      return pSVar1;
    }
  }
  sqlite3ExprDelete(db_00,pOn);
  sqlite3IdListDelete(db_00,pUsing);
  sqlite3SelectDelete(db_00,pSubquery);
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppendFromTerm(
  Parse *pParse,          /* Parsing context */
  SrcList *p,             /* The left part of the FROM clause already seen */
  Token *pTable,          /* Name of the table to add to the FROM clause */
  Token *pDatabase,       /* Name of the database containing pTable */
  Token *pAlias,          /* The right-hand side of the AS subexpression */
  Select *pSubquery,      /* A subquery used in place of a table name */
  Expr *pOn,              /* The ON clause of a join */
  IdList *pUsing          /* The USING clause of a join */
){
  struct SrcList_item *pItem;
  sqlite3 *db = pParse->db;
  if( !p && (pOn || pUsing) ){
    sqlite3ErrorMsg(pParse, "a JOIN clause is required before %s", 
      (pOn ? "ON" : "USING")
    );
    goto append_from_error;
  }
  p = sqlite3SrcListAppend(pParse, p, pTable, pDatabase);
  if( p==0 ){
    goto append_from_error;
  }
  assert( p->nSrc>0 );
  pItem = &p->a[p->nSrc-1];
  assert( (pTable==0)==(pDatabase==0) );
  assert( pItem->zName==0 || pDatabase!=0 );
  if( IN_RENAME_OBJECT && pItem->zName ){
    Token *pToken = (ALWAYS(pDatabase) && pDatabase->z) ? pDatabase : pTable;
    sqlite3RenameTokenMap(pParse, pItem->zName, pToken);
  }
  assert( pAlias!=0 );
  if( pAlias->n ){
    pItem->zAlias = sqlite3NameFromToken(db, pAlias);
  }
  pItem->pSelect = pSubquery;
  pItem->pOn = pOn;
  pItem->pUsing = pUsing;
  return p;

 append_from_error:
  assert( p==0 );
  sqlite3ExprDelete(db, pOn);
  sqlite3IdListDelete(db, pUsing);
  sqlite3SelectDelete(db, pSubquery);
  return 0;
}